

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_new(lyd_node *parent,lys_module *module,char *name)

{
  ly_ctx *ctx;
  lys_node *plVar1;
  char *mod;
  int iVar2;
  lys_node *node;
  lys_node *parent_00;
  size_t sVar3;
  lys_module *plVar4;
  lys_node *siblings;
  lys_node *snode;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  siblings = (lys_node *)0x0;
  snode = (lys_node *)name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  if (((parent == (lyd_node *)0x0) && (module == (lys_module *)0x0)) || (name == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new");
    parent_local = (lyd_node *)0x0;
  }
  else {
    node = lyd_new_find_schema(parent,module,0);
    mod = name_local;
    if (node == (lys_node *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new");
      parent_local = (lyd_node *)0x0;
    }
    else {
      parent_00 = lys_parent(node);
      plVar1 = snode;
      sVar3 = strlen((char *)snode);
      iVar2 = lys_getnext_data((lys_module *)mod,parent_00,(char *)plVar1,(int)sVar3,
                               LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER,0,&siblings);
      plVar1 = snode;
      if ((iVar2 == 0) && (siblings != (lys_node *)0x0)) {
        parent_local = _lyd_new((lyd_node *)module_local,siblings,0);
      }
      else {
        ctx = node->module->ctx;
        plVar4 = lys_node_module(node);
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Failed to find \"%s\" as a sibling to \"%s:%s\".",plVar1,
               plVar4->name,node->name);
        parent_local = (lyd_node *)0x0;
      }
    }
  }
  return parent_local;
}

Assistant:

lyd_node *
lyd_new(struct lyd_node *parent, const struct lys_module *module, const char *name)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        LOGARG;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 0);
    if (!siblings) {
        LOGARG;
        return NULL;
    }

    if (lys_getnext_data(module, lys_parent(siblings), name, strlen(name), LYS_CONTAINER | LYS_LIST | LYS_NOTIF
                         | LYS_RPC | LYS_ACTION, 0, &snode) || !snode) {
        LOGERR(siblings->module->ctx, LY_EINVAL, "Failed to find \"%s\" as a sibling to \"%s:%s\".",
               name, lys_node_module(siblings)->name, siblings->name);
        return NULL;
    }

    return _lyd_new(parent, snode, 0);
}